

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_object.cpp
# Opt level: O2

void __thiscall booster::shared_object::shared_object(shared_object *this,string *name)

{
  int iVar1;
  data *pdVar2;
  runtime_error *this_00;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pdVar2 = (data *)operator_new(8);
  pdVar2->handle = (void *)0x0;
  (this->d).ptr_ = pdVar2;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  iVar1 = open(this,(char *)name,(int)&err);
  if ((char)iVar1 != '\0') {
    std::__cxx11::string::~string((string *)&err);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::operator+(&local_80,"booster::shared_object: failed to load shared library ",name);
  std::operator+(&local_60,&local_80,": ");
  std::operator+(&local_40,&local_60,&err);
  runtime_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

shared_object::shared_object(std::string const &name) : d(new data())
	{
		std::string err;
		if(!open(name,err)) {
			throw booster::runtime_error("booster::shared_object: failed to load shared library " + name +": " + err);
		}
	}